

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

fy_event * fy_parser_parse(fy_parser *fyp)

{
  fy_eventp *pfVar1;
  fy_eventp *fyep;
  fy_parser *fyp_local;
  
  if (fyp == (fy_parser *)0x0) {
    fyp_local = (fy_parser *)0x0;
  }
  else {
    pfVar1 = fy_parse_private(fyp);
    if (pfVar1 == (fy_eventp *)0x0) {
      fyp_local = (fy_parser *)0x0;
    }
    else {
      fyp_local = (fy_parser *)&pfVar1->e;
    }
  }
  return (fy_event *)fyp_local;
}

Assistant:

struct fy_event *fy_parser_parse(struct fy_parser *fyp) {
    struct fy_eventp *fyep;

    if (!fyp)
        return NULL;

    fyep = fy_parse_private(fyp);
    if (!fyep)
        return NULL;

    return &fyep->e;
}